

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::Write(GB *this,u16 addr,u8 val)

{
  bool bVar1;
  byte bStack_11;
  u8 val_local;
  u16 addr_local;
  GB *this_local;
  
  switch(addr >> 0xc) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    Write_ROM(this,addr & 0x7fff,val);
    break;
  case 8:
  case 9:
    bVar1 = using_vram(this);
    if (!bVar1) {
      (this->s).vramp[(int)(addr & 0x1fff)] = val;
    }
    break;
  case 10:
  case 0xb:
    if (((this->s).sram_enabled & 1U) != 0) {
      (this->s).sramp[(int)((addr & (this->cart).sram_addr_mask) & 0x1fff)] = val;
    }
    break;
  case 0xc:
  case 0xe:
    (this->s).wram0p[(int)(addr & 0xfff)] = val;
    break;
  case 0xd:
    (this->s).wram1p[(int)(addr & 0xfff)] = val;
    break;
  case 0xf:
    bStack_11 = (byte)(addr >> 8);
    if ((bStack_11 & 0xf) == 0xe) {
      bVar1 = using_oam(this);
      if (!bVar1) {
        (this->s).oam[(int)(addr & 0xff)] = val;
      }
    }
    else if ((bStack_11 & 0xf) == 0xf) {
      Write_IO(this,(u8)addr,val);
    }
    else {
      (this->s).wram1p[(int)(addr & 0xfff)] = val;
    }
  }
  return;
}

Assistant:

void GB::Write(u16 addr, u8 val) {
  switch (addr >> 12) {
    case 0: case 1: case 2: case 3: case 4: case 5: case 6: case 7:
      Write_ROM(addr & 0x7fff, val);
      break;
    case 8: case 9: if (!using_vram()) { s.vramp[addr & 0x1fff] = val; } break;
    case 10: case 11:
      if (s.sram_enabled) {
        s.sramp[addr & cart.sram_addr_mask & 0x1fff] = val;
      }
      break;
    case 12: case 14: s.wram0p[addr & 0xfff] = val; break;
    case 13: s.wram1p[addr & 0xfff] = val; break;
    case 15:
      switch ((addr >> 8) & 0xf) {
        default: s.wram1p[addr & 0xfff] = val; break;
        case 14: if (!using_oam()) { s.oam[addr & 0xff] = val; } break;
        case 15: Write_IO(addr & 0xff, val); break;
      }
  }
}